

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Player.cpp
# Opt level: O1

void __thiscall
helics::apps::Player::addMessage
          (Player *this,Time sendTime,string_view src,string_view dest,string_view payload)

{
  pointer pMVar1;
  
  CLI::std::vector<helics::apps::MessageHolder,_std::allocator<helics::apps::MessageHolder>_>::
  resize(&this->messages,
         ((long)(this->messages).
                super__Vector_base<helics::apps::MessageHolder,_std::allocator<helics::apps::MessageHolder>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(this->messages).
                super__Vector_base<helics::apps::MessageHolder,_std::allocator<helics::apps::MessageHolder>_>
                ._M_impl.super__Vector_impl_data._M_start >> 4) * -0xf0f0f0f0f0f0f0f + 1);
  pMVar1 = (this->messages).
           super__Vector_base<helics::apps::MessageHolder,_std::allocator<helics::apps::MessageHolder>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pMVar1[-1].sendTime.internalTimeCode = sendTime.internalTimeCode;
  SmallBuffer::operator=(&pMVar1[-1].mess.data,&payload);
  pMVar1 = (this->messages).
           super__Vector_base<helics::apps::MessageHolder,_std::allocator<helics::apps::MessageHolder>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (&pMVar1[-1].mess.source,0,pMVar1[-1].mess.source._M_string_length,src._M_str,src._M_len
            );
  pMVar1 = (this->messages).
           super__Vector_base<helics::apps::MessageHolder,_std::allocator<helics::apps::MessageHolder>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (&pMVar1[-1].mess.dest,0,pMVar1[-1].mess.dest._M_string_length,dest._M_str,dest._M_len);
  (this->messages).
  super__Vector_base<helics::apps::MessageHolder,_std::allocator<helics::apps::MessageHolder>_>.
  _M_impl.super__Vector_impl_data._M_finish[-1].mess.time.internalTimeCode =
       sendTime.internalTimeCode;
  return;
}

Assistant:

void Player::addMessage(Time sendTime,
                        std::string_view src,
                        std::string_view dest,
                        std::string_view payload)
{
    messages.resize(messages.size() + 1);
    messages.back().sendTime = sendTime;
    messages.back().mess.data = payload;
    messages.back().mess.source = src;
    messages.back().mess.dest = dest;
    messages.back().mess.time = sendTime;
}